

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 HashmapCurrentValue(jx9_context *pCtx,jx9_hashmap *pMap,int iDirection)

{
  jx9_vm *pjVar1;
  void *pvVar2;
  jx9_value *pObj;
  sxi32 sVar3;
  uint uVar4;
  jx9_hashmap_node *pjVar5;
  
  pjVar5 = pMap->pCur;
  if (pjVar5 != (jx9_hashmap_node *)0x0) {
    if (iDirection != 0) {
      pjVar5 = (&pjVar5->pNext)[0 < iDirection];
      pMap->pCur = pjVar5;
      if (pjVar5 == (jx9_hashmap_node *)0x0) goto LAB_001396d1;
    }
    pjVar1 = pjVar5->pMap->pVm;
    if ((pjVar5->nValIdx < (pjVar1->aMemObj).nUsed) &&
       (pvVar2 = (pjVar1->aMemObj).pBase, pvVar2 != (void *)0x0)) {
      sVar3 = jx9MemObjStore((jx9_value *)
                             ((long)pvVar2 + (ulong)(pjVar5->nValIdx * (pjVar1->aMemObj).eSize)),
                             pCtx->pRet);
      return sVar3;
    }
  }
LAB_001396d1:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  uVar4 = pObj->iFlags & 0xfffffe90U | 8;
  pObj->iFlags = uVar4;
  return uVar4;
}

Assistant:

static sxi32 HashmapCurrentValue(jx9_context *pCtx, jx9_hashmap *pMap, int iDirection)
{
	jx9_hashmap_node *pCur = pMap->pCur;
	jx9_value *pVal;
	if( pCur == 0 ){
		/* Cursor does not point to anything, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( iDirection != 0 ){
		if( iDirection > 0 ){
			/* Point to the next entry */
			pMap->pCur = pCur->pPrev; /* Reverse link */
			pCur = pMap->pCur;
		}else{
			/* Point to the previous entry */
			pMap->pCur = pCur->pNext; /* Reverse link */
			pCur = pMap->pCur;
		}
		if( pCur == 0 ){
			/* End of input reached, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
	}		
	/* Point to the desired element */
	pVal = HashmapExtractNodeValue(pCur);
	if( pVal ){
		jx9_result_value(pCtx, pVal);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}